

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

void __thiscall
wallet::ScriptPubKeyMan::WalletLogPrintf<char_const*,int>
          (ScriptPubKeyMan *this,char *fmt,char *parameters,int parameters_1)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  int *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  allocator<char> local_12d;
  int parameters_local_1;
  char *parameters_local;
  string local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [4];
  string local_58;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parameters_local_1 = parameters_1;
  parameters_local = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,fmt,&local_12d);
  std::operator+(local_d8,"%s ",&local_f8);
  (*this->m_storage->_vptr_WalletStorage[2])(local_118);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<std::__cxx11::string,char_const*,int>
              (&local_58,(tinyformat *)local_d8[0]._M_dataplus._M_p,(char *)local_118,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &parameters_local,(char **)&parameters_local_1,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    pLVar3 = LogInstance();
    local_58._M_dataplus._M_p = (pointer)0x61;
    local_58._M_string_length = 0x6f4a07;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.h"
    ;
    source_file._M_len = 0x61;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x103,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), m_storage.GetDisplayName(), parameters...);
    }